

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.h
# Opt level: O2

void __thiscall
spv::Builder::accessChainPushComponent
          (Builder *this,Id component,Id preSwizzleBaseType,CoherentFlags coherentFlags,
          uint alignment)

{
  uint *puVar1;
  CoherentFlags local_14;
  
  if (((long)(this->accessChain).swizzle.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->accessChain).swizzle.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start != 4) &&
     ((this->accessChain).component = component, (this->accessChain).preSwizzleBaseType == 0)) {
    (this->accessChain).preSwizzleBaseType = preSwizzleBaseType;
  }
  AccessChain::CoherentFlags::operator|=(&(this->accessChain).coherentFlags,&local_14);
  puVar1 = &(this->accessChain).alignment;
  *puVar1 = *puVar1 | alignment;
  return;
}

Assistant:

void accessChainPushComponent(Id component, Id preSwizzleBaseType, AccessChain::CoherentFlags coherentFlags,
        unsigned int alignment)
    {
        if (accessChain.swizzle.size() != 1) {
            accessChain.component = component;
            if (accessChain.preSwizzleBaseType == NoType)
                accessChain.preSwizzleBaseType = preSwizzleBaseType;
        }
        accessChain.coherentFlags |= coherentFlags;
        accessChain.alignment |= alignment;
    }